

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

void Bbr_FindBestPartitions
               (DdManager *dd,DdNode *bParts,int nNodes,Bbr_ImageNode_t **pNodes,int *piNode1,
               int *piNode2)

{
  int iVar1;
  int local_50;
  int Cost;
  int CostMin2;
  int CostMin1;
  int iPart2;
  int iPart1;
  DdNode *bTemp;
  int *piNode2_local;
  int *piNode1_local;
  Bbr_ImageNode_t **pNodes_local;
  int nNodes_local;
  DdNode *bParts_local;
  DdManager *dd_local;
  
  CostMin2 = -1;
  CostMin1 = -1;
  local_50 = 1000000;
  Cost = 1000000;
  for (_iPart2 = bParts; _iPart2 != dd->one; _iPart2 = (_iPart2->type).kids.T) {
    iVar1 = pNodes[_iPart2->index]->pPart->nNodes;
    if (iVar1 < Cost) {
      local_50 = Cost;
      CostMin2 = CostMin1;
      CostMin1 = _iPart2->index;
      Cost = iVar1;
    }
    else if (iVar1 < local_50) {
      CostMin2 = _iPart2->index;
      local_50 = iVar1;
    }
  }
  *piNode1 = CostMin1;
  *piNode2 = CostMin2;
  return;
}

Assistant:

void Bbr_FindBestPartitions( DdManager * dd, DdNode * bParts, 
    int nNodes, Bbr_ImageNode_t ** pNodes, 
    int * piNode1, int * piNode2 )
{
    DdNode * bTemp;
    int iPart1, iPart2;
    int CostMin1, CostMin2, Cost;

    // go through the partitions
    iPart1 = iPart2 = -1;
    CostMin1 = CostMin2 = 1000000;
    for ( bTemp = bParts; bTemp != b1; bTemp = cuddT(bTemp) )
    {
        Cost = pNodes[bTemp->index]->pPart->nNodes;
        if ( CostMin1 > Cost )
        {
            CostMin2 = CostMin1;    iPart2 = iPart1;
            CostMin1 = Cost;        iPart1 = bTemp->index;
        }
        else if ( CostMin2 > Cost )
        {
            CostMin2 = Cost;        iPart2 = bTemp->index;
        }
    }

    *piNode1 = iPart1;
    *piNode2 = iPart2;
}